

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdrawhelper.cpp
# Opt level: O0

void fetch(uint32_t *buffer,uint32_t *end,Operator *op,VSpanData *data,float det,float delta_det,
          float delta_delta_det,float b,float delta_b)

{
  uint32_t uVar1;
  long in_RCX;
  long in_RDX;
  uint32_t *in_RSI;
  uint32_t *in_RDI;
  float in_XMM0_Da;
  float fVar2;
  double dVar3;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  float w;
  uint32_t result;
  undefined8 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint32_t local_38;
  float local_30;
  float local_28;
  float local_24;
  uint32_t *local_8;
  
  local_30 = in_XMM3_Da;
  local_28 = in_XMM1_Da;
  local_24 = in_XMM0_Da;
  local_8 = in_RDI;
  if ((*(byte *)(in_RDX + 0x38) & 1) == 0) {
    while (local_8 < in_RSI) {
      std::sqrt((double)(ulong)(uint)local_24);
      uVar1 = gradientPixel((VGradientData *)
                            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            (float)((ulong)(in_RCX + 0x50) >> 0x20));
      *local_8 = uVar1;
      local_24 = local_28 + local_24;
      local_28 = in_XMM2_Da + local_28;
      local_8 = local_8 + 1;
    }
  }
  else {
    for (; local_8 < in_RSI; local_8 = local_8 + 1) {
      local_38 = 0;
      if (0.0 <= local_24) {
        dVar3 = std::sqrt((double)(ulong)(uint)local_24);
        fVar2 = SUB84(dVar3,0) - local_30;
        if (0.0 <= *(float *)(in_RDX + 0x28) * fVar2 + *(float *)(in_RCX + 0x68)) {
          local_38 = gradientPixel((VGradientData *)CONCAT44(fVar2,in_stack_ffffffffffffffc0),
                                   (float)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
        }
      }
      *local_8 = local_38;
      local_24 = local_28 + local_24;
      local_28 = in_XMM2_Da + local_28;
      local_30 = in_XMM4_Da + local_30;
    }
  }
  return;
}

Assistant:

static void fetch(uint32_t *buffer, uint32_t *end, const Operator *op,
                  const VSpanData *data, float det, float delta_det,
                  float delta_delta_det, float b, float delta_b)
{
    if (op->radial.extended) {
        while (buffer < end) {
            uint32_t result = 0;
            if (det >= 0) {
                float w = std::sqrt(det) - b;
                if (data->mGradient.radial.fradius + op->radial.dr * w >= 0)
                    result = gradientPixel(&data->mGradient, w);
            }

            *buffer = result;

            det += delta_det;
            delta_det += delta_delta_det;
            b += delta_b;

            ++buffer;
        }
    } else {
        while (buffer < end) {
            *buffer++ = gradientPixel(&data->mGradient, std::sqrt(det) - b);

            det += delta_det;
            delta_det += delta_delta_det;
            b += delta_b;
        }
    }
}